

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilReader.c
# Opt level: O0

Extra_FileReader_t *
Extra_FileReaderAlloc(char *pFileName,char *pCharsComment,char *pCharsStop,char *pCharsClean)

{
  byte *pbVar1;
  FILE *__stream;
  long lVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Int_t *pVVar5;
  long local_60;
  int local_54;
  int RetValue;
  int nCharsToRead;
  char *pChar;
  FILE *pFile;
  Extra_FileReader_t *p;
  char *pCharsClean_local;
  char *pCharsStop_local;
  char *pCharsComment_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Extra_FileReaderAlloc(): Cannot open input file \"%s\".\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)malloc(0x158);
    memset(pFileName_local,0,0x158);
    *(char **)pFileName_local = pFileName;
    *(FILE **)(pFileName_local + 8) = __stream;
    memset(pFileName_local + 0x18,1,0x100);
    for (_RetValue = (byte *)pCharsComment; pbVar1 = (byte *)pCharsStop, *_RetValue != 0;
        _RetValue = _RetValue + 1) {
      pFileName_local[(ulong)*_RetValue + 0x18] = '\0';
    }
    while (_RetValue = pbVar1, pbVar1 = (byte *)pCharsClean, *_RetValue != 0) {
      pFileName_local[(ulong)*_RetValue + 0x18] = '\x02';
      pbVar1 = _RetValue + 1;
    }
    while (_RetValue = pbVar1, *_RetValue != 0) {
      pFileName_local[(ulong)*_RetValue + 0x18] = '\x03';
      pbVar1 = _RetValue + 1;
    }
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    *(int *)(pFileName_local + 0x10) = (int)lVar2;
    rewind(__stream);
    pvVar3 = malloc(0x400001);
    *(void **)(pFileName_local + 0x118) = pvVar3;
    pFileName_local[0x120] = '\0';
    pFileName_local[0x121] = '\0';
    pFileName_local[0x122] = '@';
    pFileName_local[0x123] = '\0';
    *(undefined8 *)(pFileName_local + 0x128) = *(undefined8 *)(pFileName_local + 0x118);
    if (*(int *)(pFileName_local + 0x10) < 0x400000) {
      local_54 = *(int *)(pFileName_local + 0x10);
    }
    else {
      local_54 = 0x400000;
    }
    fread(*(void **)(pFileName_local + 0x118),(long)local_54,1,*(FILE **)(pFileName_local + 8));
    *(int *)(pFileName_local + 0x14) = local_54;
    *(long *)(pFileName_local + 0x130) = *(long *)(pFileName_local + 0x118) + (long)local_54;
    if (*(int *)(pFileName_local + 0x14) == *(int *)(pFileName_local + 0x10)) {
      local_60 = *(long *)(pFileName_local + 0x130);
    }
    else {
      local_60 = *(long *)(pFileName_local + 0x118) + 0x3ff000;
    }
    *(long *)(pFileName_local + 0x138) = local_60;
    pVVar4 = Vec_PtrAlloc(100);
    *(Vec_Ptr_t **)(pFileName_local + 0x140) = pVVar4;
    pVVar5 = Vec_IntAlloc(100);
    *(Vec_Int_t **)(pFileName_local + 0x148) = pVVar5;
    pFileName_local[0x150] = '\x01';
    pFileName_local[0x151] = '\0';
    pFileName_local[0x152] = '\0';
    pFileName_local[0x153] = '\0';
  }
  return (Extra_FileReader_t *)pFileName_local;
}

Assistant:

Extra_FileReader_t * Extra_FileReaderAlloc( char * pFileName, 
    char * pCharsComment, char * pCharsStop, char * pCharsClean )
{
    Extra_FileReader_t * p;
    FILE * pFile;
    char * pChar;
    int nCharsToRead;
    int RetValue;
    // check if the file can be opened
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Extra_FileReaderAlloc(): Cannot open input file \"%s\".\n", pFileName );
        return NULL;
    }
    // start the file reader    
    p = ABC_ALLOC( Extra_FileReader_t, 1 );
    memset( p, 0, sizeof(Extra_FileReader_t) );
    p->pFileName   = pFileName;
    p->pFile       = pFile;
    // set the character map
    memset( p->pCharMap, EXTRA_CHAR_NORMAL, 256 );
    for ( pChar = pCharsComment; *pChar; pChar++ )
        p->pCharMap[(unsigned char)*pChar] = EXTRA_CHAR_COMMENT;
    for ( pChar = pCharsStop; *pChar; pChar++ )
        p->pCharMap[(unsigned char)*pChar] = EXTRA_CHAR_STOP;
    for ( pChar = pCharsClean; *pChar; pChar++ )
        p->pCharMap[(unsigned char)*pChar] = EXTRA_CHAR_CLEAN;
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    p->nFileSize = ftell( pFile );  
    rewind( pFile ); 
    // allocate the buffer
    p->pBuffer = ABC_ALLOC( char, EXTRA_BUFFER_SIZE+1 );
    p->nBufferSize = EXTRA_BUFFER_SIZE;
    p->pBufferCur  = p->pBuffer;
    // determine how many chars to read
    nCharsToRead = EXTRA_MINIMUM(p->nFileSize, EXTRA_BUFFER_SIZE);
    // load the first part into the buffer
    RetValue = fread( p->pBuffer, nCharsToRead, 1, p->pFile );
    p->nFileRead = nCharsToRead;
    // set the ponters to the end and the stopping point
    p->pBufferEnd  = p->pBuffer + nCharsToRead;
    p->pBufferStop = (p->nFileRead == p->nFileSize)? p->pBufferEnd : p->pBuffer + EXTRA_BUFFER_SIZE - EXTRA_OFFSET_SIZE;
    // start the arrays
    p->vTokens = Vec_PtrAlloc( 100 );
    p->vLines = Vec_IntAlloc( 100 );
    p->nLineCounter = 1; // 1-based line counting
    return p;
}